

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O0

void __thiscall pg::PTLSolver::solve(PTLSolver *this)

{
  bool bVar1;
  size_t newsize;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  undefined1 local_100 [24];
  undefined1 local_e8 [4];
  int v_2;
  uint local_d4;
  undefined1 local_d0 [4];
  int v_1;
  uint local_c0;
  int v;
  byte local_aa;
  byte local_a9;
  undefined1 local_a8 [6];
  bool play1;
  bool play0;
  bitset CurG;
  PTLSolver *this_local;
  
  CurG._allocsize = (size_t)this;
  newsize = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_a8,newsize);
  this->iterations = 0;
  local_a9 = 1;
  local_aa = 1;
  do {
    bVar1 = bitset::any(&this->G);
    if (!bVar1) break;
    this->iterations = this->iterations + 1;
    if ((this->multiplayer & 1U) == 0) {
      while ((local_a9 & 1) != 0) {
        this->iterations = this->iterations + 1;
        if ((this->super_Solver).trace != 0) {
          poVar2 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->iterations + -1);
          std::operator<<(poVar2,"\x1b[m, player Even\n");
        }
        bitset::operator=((bitset *)local_a8,&this->G);
        lVar3 = Solver::nodecount(&this->super_Solver);
        local_a9 = search(this,(bitset *)local_a8,(int)lVar3 + -1,0);
        if ((this->SolvedQ0).pointer != 0) {
          std::swap<unsigned_int*>(&(this->Q).queue,&(this->SolvedQ0).queue);
          std::swap<int>(&(this->Q).pointer,&(this->SolvedQ0).pointer);
          while ((this->Q).pointer != 0) {
            iVar4 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar4;
            local_c0 = (this->Q).queue[iVar4];
            bVar1 = Game::isSolved((this->super_Solver).game,local_c0);
            if (!bVar1) {
              Solver::solve(&this->super_Solver,local_c0,0,this->str[(int)local_c0]);
            }
            bitset::operator[]((bitset *)local_d0,(size_t)&this->G);
            bitset::reference::operator=((reference *)local_d0,false);
            attractVertices(this,0,local_c0,&this->G,&this->S0,&this->G);
            attractTangles(this,0,local_c0,&this->G,&this->S0,&this->G);
          }
        }
      }
      if ((local_aa & 1) != 0) {
        if ((this->super_Solver).trace != 0) {
          poVar2 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->iterations + -1);
          std::operator<<(poVar2,"\x1b[m, player Odd\n");
        }
        bitset::operator=((bitset *)local_a8,&this->G);
        lVar3 = Solver::nodecount(&this->super_Solver);
        local_aa = search(this,(bitset *)local_a8,(int)lVar3 + -1,1);
      }
    }
    else {
      if ((this->super_Solver).trace != 0) {
        poVar2 = std::operator<<((this->super_Solver).logger,
                                 "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->iterations + -1);
        std::operator<<(poVar2,"\x1b[m\n");
      }
      bitset::operator=((bitset *)local_a8,&this->G);
      lVar3 = Solver::nodecount(&this->super_Solver);
      search(this,(bitset *)local_a8,(int)lVar3 + -1,-1);
    }
    if ((this->SolvedQ0).pointer != 0) {
      std::swap<unsigned_int*>(&(this->Q).queue,&(this->SolvedQ0).queue);
      std::swap<int>(&(this->Q).pointer,&(this->SolvedQ0).pointer);
      while ((this->Q).pointer != 0) {
        iVar4 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar4;
        local_d4 = (this->Q).queue[iVar4];
        bVar1 = Game::isSolved((this->super_Solver).game,local_d4);
        if (!bVar1) {
          Solver::solve(&this->super_Solver,local_d4,0,this->str[(int)local_d4]);
        }
        bitset::operator[]((bitset *)local_e8,(size_t)&this->G);
        bitset::reference::operator=((reference *)local_e8,false);
        attractVertices(this,0,local_d4,&this->G,&this->S0,&this->G);
        attractTangles(this,0,local_d4,&this->G,&this->S0,&this->G);
      }
    }
    if ((this->SolvedQ1).pointer != 0) {
      std::swap<unsigned_int*>(&(this->Q).queue,&(this->SolvedQ1).queue);
      std::swap<int>(&(this->Q).pointer,&(this->SolvedQ1).pointer);
      while ((this->Q).pointer != 0) {
        iVar4 = (this->Q).pointer + -1;
        (this->Q).pointer = iVar4;
        local_100._20_4_ = (this->Q).queue[iVar4];
        bVar1 = Game::isSolved((this->super_Solver).game,local_100._20_4_);
        if (!bVar1) {
          Solver::solve(&this->super_Solver,local_100._20_4_,1,this->str[(int)local_100._20_4_]);
        }
        bitset::operator[]((bitset *)local_100,(size_t)&this->G);
        bitset::reference::operator=((reference *)local_100,false);
        attractVertices(this,1,local_100._20_4_,&this->G,&this->S1,&this->G);
        attractTangles(this,1,local_100._20_4_,&this->G,&this->S1,&this->G);
      }
    }
  } while (((local_a9 & 1) != 0) || ((local_aa & 1) != 0));
  bitset::~bitset((bitset *)local_a8);
  return;
}

Assistant:

void
PTLSolver::solve()
{
    bitset CurG(nodecount());

    iterations = 0;

    bool play0 = true;
    bool play1 = true;

    while (G.any()) {
        iterations++;

        if (multiplayer) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m\n";
            CurG = G;
            search(CurG, nodecount()-1, -1);
        } else {
            // play for player 0 until no changes, then player 1

            while (play0) {
                iterations++;
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Even\n";
                CurG = G;
                play0 = search(CurG, nodecount()-1, 0);

                if (SolvedQ0.nonempty()) {
                    Q.swap(SolvedQ0);
                    while (Q.nonempty()) {
                        const int v = Q.pop();
                        // TODO: should we need the check?
                        if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                        G[v] = false; // remove from Game
                        attractVertices(0, v, G, S0, G);
                        attractTangles(0, v, G, S0, G);
                    }
                }
            }

            if (play1) {
                if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "\033[m, player Odd\n";
                CurG = G;
                play1 = search(CurG, nodecount()-1, 1);
            }
        }

        /**
         * Extend any dominions that were found.
         * (Any solved vertices are now in <Q>.)
         */

        if (SolvedQ0.nonempty()) {
            Q.swap(SolvedQ0);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 0, str[v]);
                G[v] = false; // remove from Game
                attractVertices(0, v, G, S0, G);
                attractTangles(0, v, G, S0, G);
            }
        }

        if (SolvedQ1.nonempty()) {
            Q.swap(SolvedQ1);
            while (Q.nonempty()) {
                const int v = Q.pop();
                if (!game.isSolved(v)) Solver::solve(v, 1, str[v]);
                G[v] = false; // remove from Game
                attractVertices(1, v, G, S1, G);
                attractTangles(1, v, G, S1, G);
            }
        }

        if (!play0 and !play1) break;

#if NDEBUG and 0
        if (iterations == 1000) {
            logger << "stuck\n";
            exit(-1);
        }
#endif
    }
}